

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_f2c_engine.cpp
# Opt level: O2

void adios2_begin_step_f2c_
               (adios2_engine **engine,int *step_mode,float *timeout_seconds,int *status,int *ierr)

{
  int iVar1;
  undefined8 in_RAX;
  adios2_step_status statusC;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  *status = -1;
  iVar1 = adios2_begin_step(*timeout_seconds,*engine,*step_mode,&local_14);
  *ierr = iVar1;
  if (iVar1 == 0) {
    *status = local_14;
  }
  return;
}

Assistant:

void FC_GLOBAL(adios2_begin_step_f2c,
               ADIOS2_BEGIN_STEP_F2C)(adios2_engine **engine, const int *step_mode,
                                      const float *timeout_seconds, int *status, int *ierr)
{
    *status = -1;
    adios2_step_status statusC;

    *ierr = static_cast<int>(adios2_begin_step(*engine, static_cast<adios2_step_mode>(*step_mode),
                                               *timeout_seconds, &statusC));

    if (*ierr == static_cast<int>(adios2_error_none))
    {
        *status = static_cast<int>(statusC);
    }
}